

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT> *
wasm::WATParser::typeidx<wasm::WATParser::ParseImplicitTypeDefsCtx>
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  bool bVar1;
  HeapTypeT *u;
  Lexer *this;
  allocator<char> local_e9;
  string local_e8;
  Err local_c8;
  uint local_a4;
  Err local_a0;
  Err *local_80;
  Err *err;
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
  _val;
  undefined1 local_40 [8];
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
  t;
  ParseImplicitTypeDefsCtx *ctx_local;
  
  t.val.
  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
  .
  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
  .
  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
  .
  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
  .
  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
  .
  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
  ._32_8_ = ctx;
  maybeTypeidx<wasm::WATParser::ParseImplicitTypeDefsCtx>
            ((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
              *)local_40,ctx);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_40);
  if (bVar1) {
    MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
    ::MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
                   *)&err,(MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
                           *)local_40);
    local_80 = MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
               ::getErr((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
                         *)&err);
    bVar1 = local_80 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_a0,local_80);
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>::
      Result(__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
    }
    local_a4 = (uint)bVar1;
    MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
    ::~MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
                    *)&err);
    if (local_a4 == 0) {
      u = MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
          ::operator*((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
                       *)local_40);
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>::
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT&>
                (__return_storage_ptr__,u);
      local_a4 = 1;
    }
  }
  else {
    local_a4 = 0;
  }
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
  ::~MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
                  *)local_40);
  if (local_a4 == 0) {
    this = (Lexer *)(t.val.
                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                     ._32_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"expected type index or identifier",&local_e9);
    Lexer::err(&local_c8,this,&local_e8);
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>::
    Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> typeidx(Ctx& ctx) {
  if (auto t = maybeTypeidx(ctx)) {
    CHECK_ERR(t);
    return *t;
  }
  return ctx.in.err("expected type index or identifier");
}